

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Source.cpp
# Opt level: O0

void __thiscall
helics::apps::Source::addPublication
          (Source *this,string_view key,string_view generator,DataType type,Time period,
          string_view units)

{
  string_view key_00;
  string_view units_00;
  bool bVar1;
  size_type sVar2;
  string *__k;
  mapped_type *pmVar3;
  undefined8 in_RDI;
  __sv_type _Var4;
  iterator res;
  SourceObject newObj;
  map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  *in_stack_fffffffffffffd08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd10;
  SourceObject *this_00;
  Time per;
  iterator in_stack_fffffffffffffd50;
  shared_ptr<helics::CombinationFederate> *valueFed;
  InterfaceVisibility locality;
  Publication *in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd88;
  DataType in_stack_fffffffffffffd8c;
  _Self in_stack_fffffffffffffd90;
  _Self local_268;
  string_view in_stack_fffffffffffffda0;
  size_t in_stack_fffffffffffffdb0;
  value_type *local_238;
  SourceObject *pSStack_230;
  _Self local_48;
  _Self local_40 [4];
  basic_string_view<char,_std::char_traits<char>_> local_20 [2];
  
  locality = (InterfaceVisibility)((ulong)in_RDI >> 0x20);
  valueFed = (shared_ptr<helics::CombinationFederate> *)&stack0x00000010;
  local_40[0]._M_node =
       (_Base_ptr)
       CLI::std::
       map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
       ::find(in_stack_fffffffffffffd08,(key_type *)0x40a535);
  local_48._M_node =
       (_Base_ptr)
       CLI::std::
       map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
       ::end(in_stack_fffffffffffffd08);
  bVar1 = CLI::std::operator==(local_40,&local_48);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    typeNameStringRef_abi_cxx11_(in_stack_fffffffffffffd8c);
    _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffd10);
    this_00 = (SourceObject *)
              (valueFed->super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr;
    per.internalTimeCode =
         (baseType)
         (valueFed->super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount._M_pi;
    local_238 = (value_type *)_Var4._M_len;
    pSStack_230 = (SourceObject *)_Var4._M_str;
    key_00._M_len._4_4_ = in_stack_fffffffffffffd8c;
    key_00._M_len._0_4_ = in_stack_fffffffffffffd88;
    key_00._M_str = (char *)in_stack_fffffffffffffd90._M_node;
    units_00._M_str = (char *)this_00;
    units_00._M_len = in_stack_fffffffffffffdb0;
    Publication::Publication<std::shared_ptr<helics::CombinationFederate>>
              (in_stack_fffffffffffffd80,locality,valueFed,key_00,in_stack_fffffffffffffda0,units_00
              );
    SourceObject::SourceObject(this_00,&pSStack_230->pub,per);
    Publication::~Publication(&pSStack_230->pub);
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(local_20);
    if (!bVar1) {
      in_stack_fffffffffffffd50 =
           CLI::std::
           map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
           ::find((map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                   *)local_238,(key_type *)0x40a6a1);
      local_268._M_node = in_stack_fffffffffffffd50._M_node;
      CLI::std::
      map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
      ::end((map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
             *)local_238);
      bVar1 = CLI::std::operator==(&local_268,(_Self *)&stack0xfffffffffffffd90);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        CLI::std::
        _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
        ::operator->((_Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
                      *)0x40a6f8);
      }
    }
    CLI::std::deque<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>::
    push_back((deque<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_> *)
              pSStack_230,local_238);
    sVar2 = CLI::std::deque<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>
            ::size((deque<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_> *
                   )0x40a783);
    CLI::std::deque<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>::back
              ((deque<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_> *)
               per.internalTimeCode);
    __k = Interface::getName_abi_cxx11_((Interface *)pSStack_230);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pSStack_230);
    pmVar3 = CLI::std::
             map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
             ::operator[]((map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                           *)in_stack_fffffffffffffd50._M_node,(key_type *)__k);
    *pmVar3 = (int)sVar2 + -1;
    SourceObject::~SourceObject(pSStack_230);
  }
  else {
    std::operator<<((ostream *)&std::cerr,"publication already exists\n");
  }
  return;
}

Assistant:

void Source::addPublication(std::string_view key,
                                std::string_view generator,
                                DataType type,
                                Time period,
                                std::string_view units)
    {
        // skip already existing publications
        if (pubids.find(key) != pubids.end()) {
            std::cerr << "publication already exists\n";
            return;
        }
        SourceObject newObj(Publication(useLocal ? InterfaceVisibility::LOCAL :
                                                   InterfaceVisibility::GLOBAL,
                                        fed,
                                        key,
                                        typeNameStringRef(type),
                                        units),
                            period);

        if (!generator.empty()) {
            auto res = generatorLookup.find(generator);
            if (res != generatorLookup.end()) {
                newObj.generatorIndex = res->second;
            }
        }
        sources.push_back(std::move(newObj));
        pubids[sources.back().pub.getName()] = static_cast<int>(sources.size()) - 1;
    }